

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::handleVariable
          (TParseContext *this,TSourceLoc *loc,TSymbol *symbol,TString *string)

{
  TIntermediate *pTVar1;
  TSymbolTable *this_00;
  TSymbol *pTVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  ulong uVar8;
  long lVar9;
  long *plVar10;
  TIntermSymbol *base;
  TIntermConstantUnion *index;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_02;
  const_reference pvVar11;
  undefined4 extraout_var_00;
  char *pcVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  reference ppTVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TQualifier *pTVar14;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TString *name;
  TAnonMember *local_220;
  long *local_1f8;
  TType local_1d0;
  TType local_138;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a0;
  undefined1 local_78 [8];
  TVector<const_glslang::TFunction_*> candidateList;
  bool builtIn;
  TLayoutGeometry primitiveType;
  TIntermTyped *constNode;
  TIntermTyped *container;
  TAnonMember *anon;
  TVariable *variable;
  TIntermTyped *node;
  TString *string_local;
  TSymbol *symbol_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  string_local = (TString *)symbol;
  symbol_local = (TSymbol *)loc;
  loc_local = (TSourceLoc *)this;
  if ((symbol != (TSymbol *)0x0) &&
     (iVar4 = (*symbol->_vptr_TSymbol[0x11])(), pTVar2 = symbol_local, iVar4 != 0)) {
    uVar5 = (*(code *)(string_local->_M_dataplus).super_allocator_type.allocator[1].freeList)();
    uVar7 = (*(code *)(string_local->_M_dataplus).super_allocator_type.allocator[1].inUseList)();
    this_01 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (*(code *)((string_local->_M_dataplus).super_allocator_type.allocator)->headerSkip)();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
              (this_01);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,pTVar2,(ulong)uVar5,uVar7);
  }
  if ((string_local != (TString *)0x0) &&
     (uVar8 = (*(code *)(string_local->_M_dataplus).super_allocator_type.allocator[1].stack.
                        super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                        ._M_impl.super__Vector_impl_data._M_finish)(), (uVar8 & 1) != 0)) {
    plVar10 = (long *)(*(code *)(string_local->_M_dataplus).super_allocator_type.allocator[1].
                                pageSize)();
    uVar8 = (**(code **)(*plVar10 + 0x180))();
    if ((uVar8 & 1) == 0) {
      plVar10 = (long *)(*(code *)(string_local->_M_dataplus).super_allocator_type.allocator[1].
                                  pageSize)();
      uVar8 = (**(code **)(*plVar10 + 0x1a8))();
      if ((uVar8 & 1) == 0) {
        lVar9 = (*(code *)((string_local->_M_dataplus).super_allocator_type.allocator)->totalBytes)
                          ();
        if (lVar9 != 0) {
          plVar10 = (long *)(*(code *)((string_local->_M_dataplus).super_allocator_type.allocator)->
                                      totalBytes)();
          plVar10 = (long *)(**(code **)(*plVar10 + 0xb0))();
          plVar10 = (long *)(**(code **)(*plVar10 + 0x60))();
          uVar8 = (**(code **)(*plVar10 + 0x1a8))();
          if ((uVar8 & 1) != 0) goto LAB_0067eef5;
        }
      }
      else {
LAB_0067eef5:
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4e])
                  (this,&string_local);
      }
    }
  }
  if (string_local == (TString *)0x0) {
    local_1f8 = (long *)0x0;
  }
  else {
    local_1f8 = (long *)(*(code *)((string_local->_M_dataplus).super_allocator_type.allocator)->
                                  totalBytes)();
  }
  if (local_1f8 != (long *)0x0) {
    plVar10 = (long *)(**(code **)(*local_1f8 + 0xb0))();
    anon = (TAnonMember *)(**(code **)(*plVar10 + 0x50))();
    base = TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      (TVariable *)anon,(TSourceLoc *)symbol_local);
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    uVar5 = (**(code **)(*local_1f8 + 0xb8))();
    index = TIntermediate::addConstantUnion(pTVar1,uVar5,(TSourceLoc *)symbol_local,false);
    variable = (TVariable *)
               TIntermediate::addIndex
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          EOpIndexDirectStruct,&base->super_TIntermTyped,&index->super_TIntermTyped,
                          (TSourceLoc *)symbol_local);
    iVar4 = (*(((TVariable *)anon)->super_TSymbol)._vptr_TSymbol[0xc])();
    this_02 = &TType::getStruct((TType *)CONCAT44(extraout_var,iVar4))->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    uVar5 = (**(code **)(*local_1f8 + 0xb8))();
    pvVar11 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
              operator[](this_02,(ulong)uVar5);
    (*(variable->super_TSymbol)._vptr_TSymbol[0x1d])(variable,pvVar11->type);
    iVar4 = (*(variable->super_TSymbol)._vptr_TSymbol[0x1e])();
    uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x18))();
    pTVar2 = symbol_local;
    if ((uVar8 & 1) != 0) {
      pcVar12 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (string);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar2,"member of nameless block was not redeclared",pcVar12,"");
    }
    goto LAB_0067f4a8;
  }
  if (string_local == (TString *)0x0) {
    local_220 = (TAnonMember *)0x0;
  }
  else {
    local_220 = (TAnonMember *)
                (*(code *)(((string_local->_M_dataplus).super_allocator_type.allocator)->stack).
                          super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)();
  }
  pTVar2 = symbol_local;
  anon = local_220;
  if (local_220 == (TAnonMember *)0x0) {
    if (string_local != (TString *)0x0) {
      pcVar12 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (string);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar2,"variable name expected",pcVar12);
    }
  }
  else {
    iVar4 = (*(local_220->super_TSymbol)._vptr_TSymbol[0xc])();
    uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x180))();
    pTVar2 = symbol_local;
    if ((uVar8 & 1) != 0) {
      pcVar12 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (string);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar2,"cannot be used (maybe an instance name is needed)",pcVar12);
      anon = (TAnonMember *)0x0;
    }
    if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) &&
       (anon != (TAnonMember *)0x0)) {
      candidateList.
      super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      .
      super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           TIntermediate::getOutputPrimitive
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      iVar4 = (*(anon->super_TSymbol)._vptr_TSymbol[6])();
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_02,iVar4),"gl_PrimitiveTriangleIndicesEXT");
      if ((!bVar3) ||
         (candidateList.
          super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
          .
          super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == ElgTriangles)) {
        iVar4 = (*(anon->super_TSymbol)._vptr_TSymbol[6])();
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_03,iVar4),"gl_PrimitiveLineIndicesEXT");
        if ((!bVar3) ||
           (candidateList.
            super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
            .
            super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == ElgLines)) {
          iVar4 = (*(anon->super_TSymbol)._vptr_TSymbol[6])();
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                   *)CONCAT44(extraout_var_04,iVar4),"gl_PrimitivePointIndicesEXT");
          if ((!bVar3) ||
             (candidateList.
              super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
              .
              super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == ElgPoints))
          goto LAB_0067f266;
        }
      }
      pTVar2 = symbol_local;
      pcVar12 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          (string);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar2,"cannot be used (output primitive type mismatch)",pcVar12);
      anon = (TAnonMember *)0x0;
    }
  }
LAB_0067f266:
  if (anon == (TAnonMember *)0x0) {
    candidateList.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    TVector<const_glslang::TFunction_*>::TVector((TVector<const_glslang::TFunction_*> *)local_78);
    this_00 = (this->super_TParseContextBase).symbolTable;
    std::operator+(&local_a0,string,"(");
    name = &local_a0;
    TSymbolTable::findFunctionNameList
              (this_00,name,(TVector<const_glslang::TFunction_*> *)local_78,
               (bool *)((long)&candidateList.
                               super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                               .
                               super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_a0);
    bVar3 = std::
            vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
            ::empty((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                     *)local_78);
    if ((bVar3) ||
       ((candidateList.
         super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         .
         super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0)) {
      anon = (TAnonMember *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)name);
      TType::TType(&local_1d0,EbtVoid,EvqTemporary,1,0,0,false);
      TVariable::TVariable((TVariable *)anon,string,&local_1d0,false);
      TType::~TType(&local_1d0);
    }
    else {
      anon = (TAnonMember *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)name);
      ppTVar13 = std::
                 vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                 ::operator[]((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                               *)local_78,0);
      iVar4 = (*((*ppTVar13)->super_TSymbol)._vptr_TSymbol[3])();
      ppTVar13 = std::
                 vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                 ::operator[]((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                               *)local_78,0);
      iVar6 = (*((*ppTVar13)->super_TSymbol)._vptr_TSymbol[6])();
      TType::TType(&local_138,EbtFunction,EvqTemporary,1,0,0,false);
      TVariable::TVariable
                ((TVariable *)anon,(TString *)CONCAT44(extraout_var_05,iVar4),
                 (TString *)CONCAT44(extraout_var_06,iVar6),&local_138,false);
      TType::~TType(&local_138);
    }
    TVector<const_glslang::TFunction_*>::~TVector((TVector<const_glslang::TFunction_*> *)local_78);
  }
  iVar4 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
  pTVar14 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar4) + 0x58))();
  bVar3 = TQualifier::isFrontEndConstant(pTVar14);
  if (bVar3) {
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar4 = (*(anon->super_TSymbol)._vptr_TSymbol[0x17])();
    iVar6 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
    variable = (TVariable *)
               TIntermediate::addConstantUnion
                         (pTVar1,(TConstUnionArray *)CONCAT44(extraout_var_08,iVar4),
                          (TType *)CONCAT44(extraout_var_09,iVar6),(TSourceLoc *)symbol_local,false)
    ;
  }
  else {
    variable = (TVariable *)
               TIntermediate::addSymbol
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          (TVariable *)anon,(TSourceLoc *)symbol_local);
  }
LAB_0067f4a8:
  iVar4 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
  pTVar14 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x58))();
  bVar3 = TQualifier::isIo(pTVar14);
  if (bVar3) {
    TIntermediate::addIoAccessed
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,string);
  }
  iVar4 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
  bVar3 = TType::isReference((TType *)CONCAT44(extraout_var_11,iVar4));
  if (bVar3) {
    iVar4 = (*(anon->super_TSymbol)._vptr_TSymbol[0xc])();
    pTVar14 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar4) + 0x58))();
    bVar3 = TQualifier::bufferReferenceNeedsVulkanMemoryModel(pTVar14);
    if (bVar3) {
      TIntermediate::setUseVulkanMemoryModel
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
  }
  return (TIntermTyped *)variable;
}

Assistant:

TIntermTyped* TParseContext::handleVariable(const TSourceLoc& loc, TSymbol* symbol, const TString* string)
{
    TIntermTyped* node = nullptr;

    // Error check for requiring specific extensions present.
    if (symbol && symbol->getNumExtensions())
        requireExtensions(loc, symbol->getNumExtensions(), symbol->getExtensions(), symbol->getName().c_str());

    if (symbol && symbol->isReadOnly()) {
        // All shared things containing an unsized array must be copied up
        // on first use, so that all future references will share its array structure,
        // so that editing the implicit size will effect all nodes consuming it,
        // and so that editing the implicit size won't change the shared one.
        //
        // If this is a variable or a block, check it and all it contains, but if this
        // is a member of an anonymous block, check the whole block, as the whole block
        // will need to be copied up if it contains an unsized array.
        //
        // This check is being done before the block-name check further down, so guard
        // for that too.
        if (!symbol->getType().isUnusableName()) {
            if (symbol->getType().containsUnsizedArray() ||
                (symbol->getAsAnonMember() &&
                 symbol->getAsAnonMember()->getAnonContainer().getType().containsUnsizedArray()))
                makeEditable(symbol);
        }
    }

    const TVariable* variable;
    const TAnonMember* anon = symbol ? symbol->getAsAnonMember() : nullptr;
    if (anon) {
        // It was a member of an anonymous container.

        // Create a subtree for its dereference.
        variable = anon->getAnonContainer().getAsVariable();
        TIntermTyped* container = intermediate.addSymbol(*variable, loc);
        TIntermTyped* constNode = intermediate.addConstantUnion(anon->getMemberNumber(), loc);
        node = intermediate.addIndex(EOpIndexDirectStruct, container, constNode, loc);

        node->setType(*(*variable->getType().getStruct())[anon->getMemberNumber()].type);
        if (node->getType().hiddenMember())
            error(loc, "member of nameless block was not redeclared", string->c_str(), "");
    } else {
        // Not a member of an anonymous container.

        // The symbol table search was done in the lexical phase.
        // See if it was a variable.
        variable = symbol ? symbol->getAsVariable() : nullptr;
        if (variable) {
            if (variable->getType().isUnusableName()) {
                error(loc, "cannot be used (maybe an instance name is needed)", string->c_str(), "");
                variable = nullptr;
            }

            if (language == EShLangMesh && variable) {
                TLayoutGeometry primitiveType = intermediate.getOutputPrimitive();
                if ((variable->getMangledName() == "gl_PrimitiveTriangleIndicesEXT" && primitiveType != ElgTriangles) ||
                    (variable->getMangledName() == "gl_PrimitiveLineIndicesEXT" && primitiveType != ElgLines) ||
                    (variable->getMangledName() == "gl_PrimitivePointIndicesEXT" && primitiveType != ElgPoints)) {
                    error(loc, "cannot be used (output primitive type mismatch)", string->c_str(), "");
                    variable = nullptr;
                }
            }
        } else {
            if (symbol)
                error(loc, "variable name expected", string->c_str(), "");
        }

        // Recovery, if it wasn't found or was not a variable.
        if (! variable) {
            bool builtIn = false;
            TVector<const TFunction*> candidateList;
            symbolTable.findFunctionNameList(*string + "(", candidateList, builtIn);

            // If it's a function, pass the name/mangledName
            if (!candidateList.empty() && !builtIn) {
                variable = new TVariable(&candidateList[0]->getName(), &candidateList[0]->getMangledName(), TType(EbtFunction));
            } else {
                variable = new TVariable(string, TType(EbtVoid));
            }
        }

        if (variable->getType().getQualifier().isFrontEndConstant())
            node = intermediate.addConstantUnion(variable->getConstArray(), variable->getType(), loc);
        else
            node = intermediate.addSymbol(*variable, loc);
    }

    if (variable->getType().getQualifier().isIo())
        intermediate.addIoAccessed(*string);

    if (variable->getType().isReference() &&
        variable->getType().getQualifier().bufferReferenceNeedsVulkanMemoryModel()) {
        intermediate.setUseVulkanMemoryModel();
    }

    return node;
}